

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::maybe_send_request
          (ut_metadata_peer_plugin *this)

{
  ut_metadata_plugin *this_00;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  int local_14;
  ut_metadata_peer_plugin *puStack_10;
  int piece;
  ut_metadata_peer_plugin *this_local;
  
  puStack_10 = this;
  uVar2 = (*(this->m_pc->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[1])();
  if (((((uVar2 & 1) == 0) &&
       (bVar1 = libtorrent::aux::torrent::valid_metadata(this->m_torrent), !bVar1)) &&
      (this->m_message_index != 0)) &&
     ((sVar3 = ::std::vector<int,_std::allocator<int>_>::size(&this->m_sent_requests), sVar3 < 2 &&
      (bVar1 = has_metadata(this), bVar1)))) {
    this_00 = this->m_tp;
    bVar1 = libtorrent::aux::peer_connection::has_metadata(&this->m_pc->super_peer_connection);
    local_14 = ut_metadata_plugin::metadata_request(this_00,bVar1);
    if (local_14 != -1) {
      ::std::vector<int,_std::allocator<int>_>::push_back(&this->m_sent_requests,&local_14);
      write_metadata_packet(this,request,local_14);
    }
  }
  return;
}

Assistant:

void maybe_send_request()
		{
			if (m_pc.is_disconnecting()) return;

			// if we don't have any metadata, and this peer
			// supports the request metadata extension
			// and we aren't currently waiting for a request
			// reply. Then, send a request for some metadata.
			if (!m_torrent.valid_metadata()
				&& m_message_index != 0
				&& m_sent_requests.size() < 2
				&& has_metadata())
			{
				int const piece = m_tp.metadata_request(m_pc.has_metadata());
				if (piece == -1) return;

				m_sent_requests.push_back(piece);
				write_metadata_packet(msg_t::request, piece);
			}
		}